

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

amqp_rpc_reply_t *
amqp_login_inner(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,char *vhost,
                int channel_max,int frame_max,int heartbeat,amqp_table_t *client_properties,
                timeval *timeout,amqp_sasl_method_enum sasl_method,__va_list_tag *vl)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  amqp_bytes_t aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  amqp_rpc_reply_t *in_RAX;
  amqp_rpc_reply_t *paVar9;
  ulong uVar10;
  amqp_pool_t *pool;
  undefined4 in_register_0000000c;
  amqp_time_t aVar11;
  amqp_method_number_t extraout_EDX;
  bool bVar12;
  amqp_bytes_t aVar13;
  amqp_table_t client_capabilities_table;
  amqp_connection_tune_ok_t s;
  amqp_table_t default_table;
  amqp_method_number_t replies [2];
  amqp_time_t local_248;
  amqp_pool_t *local_240;
  amqp_method_t local_238;
  amqp_table_t *local_228;
  void *local_220;
  size_t local_218;
  char *local_210;
  undefined1 local_208 [48];
  amqp_table_t local_1d8;
  undefined1 local_1c8 [24];
  anon_union_16_15_ecedea02_for_value local_1b0 [2];
  undefined8 *local_190;
  int64_t iStack_188;
  void *local_180;
  undefined1 local_178 [56];
  undefined8 *local_140;
  int64_t iStack_138;
  void *local_130;
  undefined8 *local_118;
  int64_t iStack_110;
  void *local_108;
  undefined8 *local_f0;
  int64_t iStack_e8;
  void *local_e0;
  undefined8 *local_c8;
  int64_t iStack_c0;
  void *local_b8;
  undefined8 *local_a0;
  int64_t iStack_98;
  void *local_90;
  amqp_table_t local_88;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  char *local_60;
  size_t local_58;
  void *local_50;
  undefined8 local_48;
  char *local_40;
  
  aVar11.time_point_ns = CONCAT44(in_register_0000000c,channel_max);
  if (((0xffff < (uint)channel_max) || (frame_max < 0)) || (0xffff < (uint)heartbeat)) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -10;
    return in_RAX;
  }
  local_210 = vhost;
  uVar7 = amqp_time_from_now(&local_248,timeout);
  if (uVar7 == 0) {
    aVar11.time_point_ns = local_248.time_point_ns;
    uVar10 = amqp_try_send(state,&send_header_inner_header,8,local_248,0);
    aVar13.bytes = local_220;
    aVar13.len = local_218;
    bVar12 = (int)uVar10 != 0;
    aVar11.time_point_ns = CONCAT71((int7)(aVar11.time_point_ns >> 8),bVar12);
    if (uVar10 == 8 || !bVar12) {
      local_178._0_8_ = 0xa000a;
      aVar11.time_point_ns = local_248.time_point_ns;
      uVar7 = amqp_simple_wait_method_list
                        (state,0,(amqp_method_number_t *)local_178,local_248,&local_238);
      aVar4.bytes = local_220;
      aVar4.len = local_218;
      aVar13.bytes = local_220;
      aVar13.len = local_218;
      if (uVar7 != 0) goto LAB_00109cc1;
      uVar10 = 0xfffffffa;
      if (((char)*(size_t *)local_238.decoded == '\0') &&
         (aVar13 = aVar4, *(char *)((long)(size_t *)local_238.decoded + 1) == '\t')) {
        local_240 = (amqp_pool_t *)local_238.decoded;
        uVar7 = amqp_table_clone((amqp_table_t *)((long)local_238.decoded + 8),
                                 &state->server_properties,&state->properties_pool);
        if (uVar7 != 0) goto LAB_00109cc1;
        iVar8 = sasl_mechanism_in_list(*(amqp_bytes_t *)&local_240->large_blocks,sasl_method);
        aVar13.bytes = local_220;
        aVar13.len = local_218;
        if (iVar8 == 0) {
          uVar10 = 0xffffffed;
        }
        else {
          pool = amqp_get_or_create_channel_pool(state,0);
          aVar13.bytes = local_220;
          aVar13.len = local_218;
          uVar10 = 0xffffffff;
          if (pool != (amqp_pool_t *)0x0) {
            local_240 = pool;
            aVar13 = sasl_response(pool,sasl_method,vl);
            local_220 = aVar13.bytes;
            local_218 = aVar13.len;
            if (local_220 != (void *)0x0) {
              amqp_table_construct_bool_entry
                        ((amqp_table_entry_t *)local_1c8,"authentication_failure_close",1);
              amqp_table_construct_bool_entry
                        ((amqp_table_entry_t *)local_208,"exchange_exchange_bindings",1);
              local_180 = (void *)local_208._32_8_;
              local_190 = (undefined8 *)local_208._16_8_;
              iStack_188 = local_208._24_8_;
              local_1d8.num_entries = 2;
              local_1d8.entries = (amqp_table_entry_t *)local_1c8;
              amqp_table_construct_utf8_entry
                        ((amqp_table_entry_t *)local_178,"product","rabbitmq-c");
              amqp_table_construct_utf8_entry
                        ((amqp_table_entry_t *)local_208,"version","0.16.0-pre");
              local_130 = (void *)local_208._32_8_;
              local_140 = (undefined8 *)local_208._16_8_;
              iStack_138 = local_208._24_8_;
              amqp_table_construct_utf8_entry((amqp_table_entry_t *)local_208,"platform","Linux");
              local_108 = (void *)local_208._32_8_;
              local_118 = (undefined8 *)local_208._16_8_;
              iStack_110 = local_208._24_8_;
              amqp_table_construct_utf8_entry
                        ((amqp_table_entry_t *)local_208,"copyright",
                         "Copyright (c) 2007-2014 VMWare Inc, Tony Garnock-Jones, and Alan Antonuk."
                        );
              local_e0 = (void *)local_208._32_8_;
              local_f0 = (undefined8 *)local_208._16_8_;
              iStack_e8 = local_208._24_8_;
              amqp_table_construct_utf8_entry
                        ((amqp_table_entry_t *)local_208,"information",
                         "See https://github.com/alanxz/rabbitmq-c");
              local_b8 = (void *)local_208._32_8_;
              local_c8 = (undefined8 *)local_208._16_8_;
              iStack_c0 = local_208._24_8_;
              amqp_table_construct_table_entry
                        ((amqp_table_entry_t *)local_208,"capabilities",&local_1d8);
              local_90 = (void *)local_208._32_8_;
              local_a0 = (undefined8 *)local_208._16_8_;
              iStack_98 = local_208._24_8_;
              local_88.entries = (amqp_table_entry_t_ *)local_178;
              local_88.num_entries = 6;
              local_228 = &state->client_properties;
              aVar11.time_point_ns = (uint64_t)local_240;
              uVar7 = amqp_merge_capabilities(&local_88,client_properties,local_228,local_240);
              if (uVar7 == 0) {
                local_78 = *(undefined8 *)local_228;
                uStack_70 = *(undefined4 *)&local_228->entries;
                uStack_6c = *(undefined4 *)((long)&local_228->entries + 4);
                if (sasl_method == AMQP_SASL_METHOD_PLAIN) {
                  local_60 = "PLAIN";
                  local_68 = 5;
                }
                else {
                  if (sasl_method != AMQP_SASL_METHOD_EXTERNAL) {
                    amqp_abort("Invalid SASL method: %d",(ulong)(uint)sasl_method);
                  }
                  local_60 = "EXTERNAL";
                  local_68 = 8;
                }
                local_208._16_8_ = &local_78;
                local_58 = local_218;
                local_50 = local_220;
                local_48 = 5;
                local_40 = "en_US";
                local_208[0] = '\x01';
                local_208._2_2_ = 0;
                local_208._8_4_ = 0xa000b;
                aVar11.time_point_ns = local_248.time_point_ns;
                uVar7 = amqp_send_frame_inner(state,(amqp_frame_t *)local_208,0,local_248);
                if (-1 < (int)uVar7) {
                  amqp_release_buffers(state);
                  aVar11.time_point_ns = local_248.time_point_ns;
                  uVar7 = amqp_simple_wait_method_list
                                    (state,0,(amqp_method_number_t *)&DAT_0010d1b0,local_248,
                                     &local_238);
                  if (uVar7 == 0) {
                    if (local_238.id == 0xa0032) {
                      local_1b0[0]._0_4_ = 0;
                      local_1c8._8_4_ = 0xa0032;
                      paVar9 = (amqp_rpc_reply_t *)0x3;
                      goto LAB_00109cdb;
                    }
                    uVar1 = (ushort)*(size_t *)local_238.decoded;
                    uVar7 = -(uint)(uVar1 == 0) | channel_max;
                    if (channel_max != 0) {
                      uVar7 = channel_max;
                    }
                    uVar3 = (uint)uVar1;
                    if (channel_max - 1U < (uint)uVar1) {
                      uVar3 = uVar7;
                    }
                    uVar2 = *(uint *)((long)(size_t *)local_238.decoded + 4);
                    if (uVar1 == 0) {
                      uVar3 = uVar7;
                    }
                    channel_max = frame_max;
                    if (uVar2 < (uint)frame_max) {
                      channel_max = uVar2;
                    }
                    uVar1 = (ushort)((amqp_pool_blocklist_t *)((long)local_238.decoded + 8))->
                                    num_blocks;
                    if (uVar2 == 0) {
                      channel_max = frame_max;
                    }
                    frame_max = heartbeat;
                    if ((uint)uVar1 < (uint)heartbeat) {
                      frame_max = (uint)uVar1;
                    }
                    if (uVar1 == 0) {
                      frame_max = heartbeat;
                    }
                    aVar11.time_point_ns = (uint64_t)(frame_max & 0xffffU);
                    uVar7 = amqp_tune_connection
                                      (state,uVar3 & 0xffff,channel_max,frame_max & 0xffffU);
                    auVar5 = local_178._0_16_;
                    heartbeat = uVar3;
                    if (-1 < (int)uVar7) {
                      local_1c8._0_2_ = (short)uVar3;
                      local_1c8._8_2_ = (short)frame_max;
                      local_178[0] = 1;
                      auVar6 = local_178._0_16_;
                      local_178._4_12_ = auVar5._4_12_;
                      local_178._0_2_ = auVar6._0_2_;
                      local_178._2_2_ = 0;
                      auVar6 = local_178._0_16_;
                      local_178._12_4_ = auVar5._12_4_;
                      local_178._0_8_ = auVar6._0_8_;
                      local_178._8_4_ = 0xa001f;
                      local_178._16_8_ = local_1c8;
                      aVar11.time_point_ns = local_248.time_point_ns;
                      local_1c8._4_4_ = channel_max;
                      uVar7 = amqp_send_frame_inner(state,(amqp_frame_t *)local_178,0,local_248);
                      if (-1 < (int)uVar7) {
                        amqp_release_buffers(state);
                        local_78 = 0xa0029;
                        local_178._0_16_ = (undefined1  [16])amqp_cstring_bytes(local_210);
                        local_178._16_8_ = 0;
                        local_178._24_8_ = (void *)0x0;
                        local_178._32_4_ = 1;
                        simple_rpc_inner((amqp_rpc_reply_t *)local_1c8,state,0,0xa0028,
                                         (amqp_method_number_t *)&local_78,local_178,local_248);
                        frame_max = local_1c8._4_4_;
                        paVar9 = (amqp_rpc_reply_t *)(ulong)(uint)local_1c8._0_4_;
                        local_238.decoded = (void *)local_1c8._16_8_;
                        channel_max = local_1b0[0].decimal.value;
                        local_238._4_4_ = local_1c8._12_4_;
                        if (local_1c8._0_4_ == AMQP_RESPONSE_NORMAL) {
                          amqp_maybe_release_buffers(state);
                          paVar9 = (amqp_rpc_reply_t *)0x1;
                          local_238.decoded = (amqp_pool_t *)0x0;
                          local_1b0[0]._0_4_ = 0;
                          local_1c8._8_4_ = 0;
                        }
                        goto LAB_00109cdb;
                      }
                    }
                  }
                }
              }
              goto LAB_00109cc1;
            }
          }
        }
      }
    }
  }
  else {
LAB_00109cc1:
    aVar13.bytes = local_220;
    aVar13.len = local_218;
    uVar10 = (ulong)uVar7;
  }
  local_220 = aVar13.bytes;
  local_218 = aVar13.len;
  (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
  paVar9 = (amqp_rpc_reply_t *)0x2;
  local_238.decoded = (void *)aVar11.time_point_ns;
  local_1c8._8_4_ = extraout_EDX;
  local_238._4_4_ = heartbeat;
  local_1b0[0]._0_4_ = (int)uVar10;
LAB_00109cdb:
  __return_storage_ptr__->reply_type = (amqp_response_type_enum)paVar9;
  *(int *)&__return_storage_ptr__->field_0x4 = frame_max;
  (__return_storage_ptr__->reply).id = local_1c8._8_4_;
  *(undefined4 *)&(__return_storage_ptr__->reply).field_0x4 = local_238._4_4_;
  (__return_storage_ptr__->reply).decoded = local_238.decoded;
  __return_storage_ptr__->library_error = local_1b0[0]._0_4_;
  *(int *)&__return_storage_ptr__->field_0x1c = channel_max;
  return paVar9;
}

Assistant:

static amqp_rpc_reply_t amqp_login_inner(amqp_connection_state_t state,
                                         char const *vhost, int channel_max,
                                         int frame_max, int heartbeat,
                                         const amqp_table_t *client_properties,
                                         const struct timeval *timeout,
                                         amqp_sasl_method_enum sasl_method,
                                         va_list vl) {
  int res;
  amqp_method_t method;

  uint16_t client_channel_max;
  uint32_t client_frame_max;
  uint16_t client_heartbeat;

  uint16_t server_channel_max;
  uint32_t server_frame_max;
  uint16_t server_heartbeat;

  amqp_rpc_reply_t result;
  amqp_time_t deadline;

  if (channel_max < 0 || channel_max > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_channel_max = (uint16_t)channel_max;

  if (frame_max < 0) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_frame_max = (uint32_t)frame_max;

  if (heartbeat < 0 || heartbeat > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }
  client_heartbeat = (uint16_t)heartbeat;

  res = amqp_time_from_now(&deadline, timeout);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = send_header_inner(state, deadline);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  res = simple_wait_method_inner(state, 0, AMQP_CONNECTION_START_METHOD,
                                 deadline, &method);
  if (AMQP_STATUS_OK != res) {
    goto error_res;
  }

  {
    amqp_connection_start_t *s = (amqp_connection_start_t *)method.decoded;
    if ((s->version_major != AMQP_PROTOCOL_VERSION_MAJOR) ||
        (s->version_minor != AMQP_PROTOCOL_VERSION_MINOR)) {
      res = AMQP_STATUS_INCOMPATIBLE_AMQP_VERSION;
      goto error_res;
    }

    res = amqp_table_clone(&s->server_properties, &state->server_properties,
                           &state->properties_pool);

    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    /* TODO: check that our chosen SASL mechanism is in the list of
       acceptable mechanisms. Or even let the application choose from
       the list! */
    if (!sasl_mechanism_in_list(s->mechanisms, sasl_method)) {
      res = AMQP_STATUS_BROKER_UNSUPPORTED_SASL_METHOD;
      goto error_res;
    }
  }

  {
    amqp_table_entry_t default_properties[6];
    amqp_table_t default_table;
    amqp_table_entry_t client_capabilities[2];
    amqp_table_t client_capabilities_table;
    amqp_connection_start_ok_t s;
    amqp_pool_t *channel_pool;
    amqp_bytes_t response_bytes;

    channel_pool = amqp_get_or_create_channel_pool(state, 0);
    if (NULL == channel_pool) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    response_bytes = sasl_response(channel_pool, sasl_method, vl);
    if (response_bytes.bytes == NULL) {
      res = AMQP_STATUS_NO_MEMORY;
      goto error_res;
    }

    client_capabilities[0] =
        amqp_table_construct_bool_entry("authentication_failure_close", 1);
    client_capabilities[1] =
        amqp_table_construct_bool_entry("exchange_exchange_bindings", 1);

    client_capabilities_table.entries = client_capabilities;
    client_capabilities_table.num_entries =
        sizeof(client_capabilities) / sizeof(amqp_table_entry_t);

    default_properties[0] =
        amqp_table_construct_utf8_entry("product", "rabbitmq-c");
    default_properties[1] =
        amqp_table_construct_utf8_entry("version", AMQP_VERSION_STRING);
    default_properties[2] =
        amqp_table_construct_utf8_entry("platform", AMQ_PLATFORM);
    default_properties[3] =
        amqp_table_construct_utf8_entry("copyright", AMQ_COPYRIGHT);
    default_properties[4] = amqp_table_construct_utf8_entry(
        "information", "See https://github.com/alanxz/rabbitmq-c");
    default_properties[5] = amqp_table_construct_table_entry(
        "capabilities", &client_capabilities_table);

    default_table.entries = default_properties;
    default_table.num_entries =
        sizeof(default_properties) / sizeof(amqp_table_entry_t);

    res = amqp_merge_capabilities(&default_table, client_properties,
                                  &state->client_properties, channel_pool);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }

    s.client_properties = state->client_properties;
    s.mechanism = sasl_method_name(sasl_method);
    s.response = response_bytes;
    s.locale = amqp_literal_bytes("en_US");

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_START_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t expected[] = {AMQP_CONNECTION_TUNE_METHOD,
                                       AMQP_CONNECTION_CLOSE_METHOD, 0};

    res = amqp_simple_wait_method_list(state, 0, expected, deadline, &method);
    if (AMQP_STATUS_OK != res) {
      goto error_res;
    }
  }

  if (AMQP_CONNECTION_CLOSE_METHOD == method.id) {
    result.reply_type = AMQP_RESPONSE_SERVER_EXCEPTION;
    result.reply = method;
    result.library_error = 0;
    goto out;
  }

  {
    amqp_connection_tune_t *s = (amqp_connection_tune_t *)method.decoded;
    server_channel_max = s->channel_max;
    server_frame_max = s->frame_max;
    server_heartbeat = s->heartbeat;
  }

  if (server_channel_max != 0 &&
      (server_channel_max < client_channel_max || client_channel_max == 0)) {
    client_channel_max = server_channel_max;
  } else if (server_channel_max == 0 && client_channel_max == 0) {
    client_channel_max = UINT16_MAX;
  }

  if (server_frame_max != 0 && server_frame_max < client_frame_max) {
    client_frame_max = server_frame_max;
  }

  if (server_heartbeat != 0 && server_heartbeat < client_heartbeat) {
    client_heartbeat = server_heartbeat;
  }

  res = amqp_tune_connection(state, client_channel_max, client_frame_max,
                             client_heartbeat);
  if (res < 0) {
    goto error_res;
  }

  {
    amqp_connection_tune_ok_t s;
    s.frame_max = client_frame_max;
    s.channel_max = client_channel_max;
    s.heartbeat = client_heartbeat;

    res = amqp_send_method_inner(state, 0, AMQP_CONNECTION_TUNE_OK_METHOD, &s,
                                 AMQP_SF_NONE, deadline);
    if (res < 0) {
      goto error_res;
    }
  }

  amqp_release_buffers(state);

  {
    amqp_method_number_t replies[] = {AMQP_CONNECTION_OPEN_OK_METHOD, 0};
    amqp_connection_open_t s;
    s.virtual_host = amqp_cstring_bytes(vhost);
    s.capabilities = amqp_empty_bytes;
    s.insist = 1;

    result = simple_rpc_inner(state, 0, AMQP_CONNECTION_OPEN_METHOD, replies,
                              &s, deadline);
    if (result.reply_type != AMQP_RESPONSE_NORMAL) {
      goto out;
    }
  }

  result.reply_type = AMQP_RESPONSE_NORMAL;
  result.reply.id = 0;
  result.reply.decoded = NULL;
  result.library_error = 0;
  amqp_maybe_release_buffers(state);

out:
  return result;

error_res:
  amqp_socket_close(state->socket, AMQP_SC_FORCE);
  result = amqp_rpc_reply_error(res);

  goto out;
}